

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmemory.c
# Opt level: O0

void * xmlMallocAtomicLoc(size_t size,char *file,int line)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  undefined4 *puVar4;
  void *ret;
  MEMHDR *p;
  int line_local;
  char *file_local;
  size_t size_local;
  
  if (xmlMemInitialized == 0) {
    xmlInitMemory();
  }
  if (size < 0xffffffffffffffd8) {
    puVar4 = (undefined4 *)malloc(size + 0x28);
    if (puVar4 == (undefined4 *)0x0) {
      pp_Var2 = __xmlGenericError();
      p_Var1 = *pp_Var2;
      ppvVar3 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar3,"xmlMallocAtomicLoc : Out of free space\n");
      xmlMemoryDump();
      size_local = 0;
    }
    else {
      *puVar4 = 0x5aa5;
      *(size_t *)(puVar4 + 4) = size;
      puVar4[1] = 4;
      *(char **)(puVar4 + 6) = file;
      puVar4[8] = line;
      xmlMutexLock(xmlMemMutex);
      block = block + 1;
      *(ulong *)(puVar4 + 2) = (ulong)block;
      debugMemSize = size + debugMemSize;
      debugMemBlocks = debugMemBlocks + 1;
      if (debugMaxMemSize < debugMemSize) {
        debugMaxMemSize = debugMemSize;
      }
      xmlMutexUnlock(xmlMemMutex);
      if ((ulong)xmlMemStopAtBlock == *(ulong *)(puVar4 + 2)) {
        xmlMallocBreakpoint();
      }
      size_local = (size_t)(puVar4 + 10);
      if (xmlMemTraceBlockAt == (void *)size_local) {
        pp_Var2 = __xmlGenericError();
        p_Var1 = *pp_Var2;
        ppvVar3 = __xmlGenericErrorContext();
        (*p_Var1)(*ppvVar3,"%p : Malloc(%lu) Ok\n",xmlMemTraceBlockAt,size);
        xmlMallocBreakpoint();
      }
    }
  }
  else {
    pp_Var2 = __xmlGenericError();
    p_Var1 = *pp_Var2;
    ppvVar3 = __xmlGenericErrorContext();
    (*p_Var1)(*ppvVar3,"xmlMallocAtomicLoc : Unsigned overflow\n");
    xmlMemoryDump();
    size_local = 0;
  }
  return (void *)size_local;
}

Assistant:

void *
xmlMallocAtomicLoc(size_t size, const char * file, int line)
{
    MEMHDR *p;
    void *ret;

    if (!xmlMemInitialized) xmlInitMemory();
#ifdef DEBUG_MEMORY
    xmlGenericError(xmlGenericErrorContext,
	    "Malloc(%d)\n",size);
#endif

    TEST_POINT

    if (size > (MAX_SIZE_T - RESERVE_SIZE)) {
	xmlGenericError(xmlGenericErrorContext,
		"xmlMallocAtomicLoc : Unsigned overflow\n");
	xmlMemoryDump();
	return(NULL);
    }

    p = (MEMHDR *) malloc(RESERVE_SIZE+size);

    if (!p) {
	xmlGenericError(xmlGenericErrorContext,
		"xmlMallocAtomicLoc : Out of free space\n");
	xmlMemoryDump();
	return(NULL);
    }
    p->mh_tag = MEMTAG;
    p->mh_size = size;
    p->mh_type = MALLOC_ATOMIC_TYPE;
    p->mh_file = file;
    p->mh_line = line;
    xmlMutexLock(xmlMemMutex);
    p->mh_number = ++block;
    debugMemSize += size;
    debugMemBlocks++;
    if (debugMemSize > debugMaxMemSize) debugMaxMemSize = debugMemSize;
#ifdef MEM_LIST
    debugmem_list_add(p);
#endif
    xmlMutexUnlock(xmlMemMutex);

#ifdef DEBUG_MEMORY
    xmlGenericError(xmlGenericErrorContext,
	    "Malloc(%d) Ok\n",size);
#endif

    if (xmlMemStopAtBlock == p->mh_number) xmlMallocBreakpoint();

    ret = HDR_2_CLIENT(p);

    if (xmlMemTraceBlockAt == ret) {
	xmlGenericError(xmlGenericErrorContext,
			"%p : Malloc(%lu) Ok\n", xmlMemTraceBlockAt,
			(long unsigned)size);
	xmlMallocBreakpoint();
    }

    TEST_POINT

    return(ret);
}